

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

FButtonStatus * FindButton(uint key)

{
  FActionMap *pFVar1;
  FButtonStatus *pFVar2;
  
  pFVar1 = BinarySearch<FActionMap,unsigned_int>(ActionMaps,0x20,8,key);
  if (pFVar1 == (FActionMap *)0x0) {
    pFVar2 = (FButtonStatus *)0x0;
  }
  else {
    pFVar2 = pFVar1->Button;
  }
  return pFVar2;
}

Assistant:

FButtonStatus *FindButton (unsigned int key)
{
	const FActionMap *bit;

	bit = BinarySearch<FActionMap, unsigned int>
			(ActionMaps, NUM_ACTIONS, &FActionMap::Key, key);
	return bit ? bit->Button : NULL;
}